

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O1

void plutovg_canvas_font_metrics
               (plutovg_canvas_t *canvas,float *ascent,float *descent,float *line_gap,
               plutovg_rect_t *extents)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  plutovg_font_face_t *ppVar4;
  float fVar5;
  
  ppVar4 = canvas->state->font_face;
  if ((ppVar4 != (plutovg_font_face_t *)0x0) && (fVar5 = canvas->state->font_size, 0.0 < fVar5)) {
    uVar1 = *(ushort *)((ppVar4->info).data + (long)(ppVar4->info).head + 0x12);
    fVar5 = fVar5 / (float)(ushort)(uVar1 << 8 | uVar1 >> 8);
    if (ascent != (float *)0x0) {
      *ascent = (float)ppVar4->ascent * fVar5;
    }
    if (descent != (float *)0x0) {
      *descent = (float)ppVar4->descent * fVar5;
    }
    if (line_gap != (float *)0x0) {
      *line_gap = (float)ppVar4->line_gap * fVar5;
    }
    if (extents != (plutovg_rect_t *)0x0) {
      iVar2 = ppVar4->x1;
      extents->x = (float)iVar2 * fVar5;
      iVar3 = ppVar4->y2;
      extents->y = (float)iVar3 * -fVar5;
      extents->w = (float)(ppVar4->x2 - iVar2) * fVar5;
      extents->h = (float)(ppVar4->y1 - iVar3) * -fVar5;
    }
    return;
  }
  if (ascent != (float *)0x0) {
    *ascent = 0.0;
  }
  if (descent != (float *)0x0) {
    *descent = 0.0;
  }
  if (line_gap != (float *)0x0) {
    *line_gap = 0.0;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return;
}

Assistant:

void plutovg_canvas_font_metrics(const plutovg_canvas_t* canvas, float* ascent, float* descent, float* line_gap, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        plutovg_font_face_get_metrics(state->font_face, state->font_size, ascent, descent, line_gap, extents);
        return;
    }

    if(ascent) *ascent = 0.f;
    if(descent) *descent = 0.f;
    if(line_gap) *line_gap = 0.f;
    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }
}